

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ArenaStringPtr *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar1;
  char *pcVar2;
  ErrorCollector *pEVar3;
  ulong uVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  Arena *arena;
  ulong uVar8;
  bool bVar9;
  LocationRecorder location;
  long *local_88;
  long local_80;
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  LocationRecorder local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar5 = Consume(this,"message");
  if (!bVar5) {
    return false;
  }
  LocationRecorder::Init(&local_68,message_location,message_location->source_code_info_);
  LocationRecorder::AddPath(&local_68,1);
  LocationRecorder::RecordLegacyLocation(&local_68,&message->super_Message,NAME);
  *(byte *)(message->_has_bits_).has_bits_ = (byte)(message->_has_bits_).has_bits_[0] | 1;
  this_00 = &message->name_;
  arena = (Arena *)(message->_internal_metadata_).
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   .ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
  }
  if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  bVar5 = ConsumeIdentifier(this,this_00->ptr_,"Expected message name.");
  if (!bVar5) {
    LocationRecorder::~LocationRecorder(&local_68);
    return false;
  }
  __rhs = this_00->ptr_;
  uVar1 = __rhs->_M_string_length;
  if (uVar1 != 0) {
    pcVar2 = (__rhs->_M_dataplus)._M_p;
    if ((byte)(*pcVar2 + 0xbfU) < 0x1a) {
      bVar9 = uVar1 == 1;
      if ((!bVar9) && (pcVar2[1] != '_')) {
        uVar4 = 2;
        do {
          uVar8 = uVar4;
          if (uVar1 == uVar8) break;
          uVar4 = uVar8 + 1;
        } while (pcVar2[uVar8] != '_');
        bVar9 = uVar1 <= uVar8;
      }
      if (bVar9) goto LAB_0030dea4;
    }
    std::operator+(&local_50,"Message name should be in UpperCamelCase. Found: ",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      uStack_70 = (undefined4)plVar6[3];
      uStack_6c = *(undefined4 *)((long)plVar6 + 0x1c);
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pEVar3 = this->error_collector_;
    if (pEVar3 != (ErrorCollector *)0x0) {
      (*pEVar3->_vptr_ErrorCollector[3])
                (pEVar3,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_88);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
LAB_0030dea4:
  LocationRecorder::~LocationRecorder(&local_68);
  if (!bVar5) {
    return false;
  }
  bVar5 = ParseMessageBlock(this,message,message_location,containing_file);
  return bVar5;
}

Assistant:

bool Parser::ParseMessageDefinition(
    DescriptorProto* message, const LocationRecorder& message_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(message,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
    if (!IsUpperCamelCase(message->name())) {
      AddWarning(
          "Message name should be in UpperCamelCase. Found: " +
          message->name() +
          ". See https://developers.google.com/protocol-buffers/docs/style");
    }
  }
  DO(ParseMessageBlock(message, message_location, containing_file));
  return true;
}